

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_Look(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  FSoundID *sound_id;
  AActor *this;
  char *__assertion;
  TObjPtr<AActor> *pTVar5;
  float attenuation;
  FSoundID local_3c;
  FSoundID local_38;
  FName local_34;
  NActorIterator iterator;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003ffba1;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ffb91:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ffba1:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x79e,"int AF_AActor_A_Look(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003ff8ec;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ffba1;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003ffb91;
LAB_003ff8ec:
    this = (AActor *)0x0;
  }
  if (((this->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    iterator.super_FActorIterator.id = this->args[1];
    iterator.super_FActorIterator.base = (AActor *)0x0;
    local_34.Index = 0x111;
    iterator.type = PClass::FindClass(&local_34);
    this->special = 0;
    pAVar3 = NActorIterator::Next(&iterator);
    (this->goal).field_0.p = pAVar3;
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    (this->flags5).Value = (uint)(this->args[3] != 0) << 7 | (this->flags5).Value & 0xffffff7f;
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if (((i_compatflags._1_1_ & 8) == 0) && (((this->flags).Value & 8) == 0)) {
      pTVar5 = &this->LastHeard;
    }
    else {
      pTVar5 = &this->Sector->SoundTarget;
    }
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar5);
    if ((pAVar3 == (AActor *)0x0) || (pAVar3->health < 1)) {
      pAVar3 = (AActor *)0x0;
    }
    else if ((pAVar3->player != (player_t *)0x0) && ((pAVar3->player->cheats & 8) != 0)) {
      return 0;
    }
  }
  else {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->target);
  }
  if (((this->flags).Value & 0x40000000) != 0) {
    this->visdir = -1;
  }
  if ((pAVar3 != (AActor *)0x0) && (((pAVar3->flags).Value & 4) != 0)) {
    bVar2 = AActor::IsFriend(this,pAVar3);
    if (bVar2) {
      bVar2 = P_LookForPlayers(this,(this->flags4).Value & 0x10000,(FLookExParams *)0x0);
      if (bVar2) goto LAB_003ffa41;
      if (this->SeeState == (FState *)0x0) {
        A_Wander(this,0);
      }
      else {
        AActor::SetState(this,this->SeeState,false);
      }
    }
    else {
      (this->target).field_0.p = pAVar3;
      if (((this->flags).Value & 0x20) == 0) goto LAB_003ffa41;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->target);
      bVar2 = P_CheckSight(this,pAVar3,4);
      if (bVar2) goto LAB_003ffa41;
    }
  }
  bVar2 = P_LookForPlayers(this,(this->flags4).Value & 0x10000,(FLookExParams *)0x0);
  if (!bVar2) {
    return 0;
  }
LAB_003ffa41:
  pTVar5 = &this->target;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->goal);
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)pTVar5);
  if (pAVar4 == pAVar3) {
    if (level.maptime < this->reactiontime) {
      (pTVar5->field_0).p = (AActor *)0x0;
    }
  }
  else {
    iVar1 = (this->SeeSound).super_FSoundID.ID;
    if (iVar1 != 0) {
      if (((this->flags2).Value & 0x8000) == 0) {
        sound_id = &local_3c;
        attenuation = 1.0;
        local_3c.ID = iVar1;
      }
      else {
        sound_id = &local_38;
        attenuation = 0.0;
        local_38.ID = iVar1;
      }
      S_Sound(this,2,sound_id,1.0,attenuation);
    }
  }
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)pTVar5);
  if (pAVar3 != (AActor *)0x0) {
    AActor::SetState(this,this->SeeState,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look)
{
	PARAM_SELF_PROLOGUE(AActor);

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator (NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0) self->flags5 &= ~MF5_CHASEGOAL;
		else self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)? 
			self->Sector->SoundTarget : self->LastHeard;

		// [RH] If the soundtarget is dead, don't chase it
		if (targ != NULL && targ->health <= 0)
		{
			targ = NULL;
		}

		if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
		{
			return 0;
		}
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			// If we find a valid target here, the wandering logic should *not*
			// be activated! It would cause the seestate to be set twice.
			if (P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto seeyou;

			// Let the self wander around aimlessly looking for a fight
			if (self->SeeState != NULL)
			{
				self->SetState (self->SeeState);
			}
			else
			{
				A_Wander(self);
			}
		}
		else
		{
			self->target = targ;

			if (self->flags & MF_AMBUSH)
			{
				if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING))
					goto seeyou;
			}
			else
				goto seeyou;
		}
	}
	
	if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
		return 0;
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound)
	{
		if (self->flags2 & MF2_BOSS)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target)
	{
		self->SetState (self->SeeState);
	}
	return 0;
}